

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::Swap
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *other)

{
  uint32 uVar1;
  int iVar2;
  string *psVar3;
  undefined7 uVar4;
  UnknownFieldSet UVar5;
  undefined7 uVar6;
  
  if (other != this) {
    psVar3 = this->name_;
    this->name_ = other->name_;
    other->name_ = psVar3;
    psVar3 = this->insertion_point_;
    this->insertion_point_ = other->insertion_point_;
    other->insertion_point_ = psVar3;
    psVar3 = this->content_;
    this->content_ = other->content_;
    other->content_ = psVar3;
    uVar1 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar1;
    UVar5 = this->_unknown_fields_;
    uVar6 = *(undefined7 *)&this->field_0x9;
    uVar4 = *(undefined7 *)&other->field_0x9;
    this->_unknown_fields_ = other->_unknown_fields_;
    *(undefined7 *)&this->field_0x9 = uVar4;
    other->_unknown_fields_ = UVar5;
    *(undefined7 *)&other->field_0x9 = uVar6;
    iVar2 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar2;
  }
  return;
}

Assistant:

void CodeGeneratorResponse_File::Swap(CodeGeneratorResponse_File* other) {
  if (other != this) {
    std::swap(name_, other->name_);
    std::swap(insertion_point_, other->insertion_point_);
    std::swap(content_, other->content_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}